

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlChar * xmlXPathCompNodeTest
                    (xmlXPathParserContextPtr ctxt,xmlXPathTestVal *test,xmlXPathTypeVal *type,
                    xmlChar **prefix,xmlChar *name)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  bool bVar5;
  bool bVar6;
  xmlXPathParserContextPtr pxStack_38;
  int blanks;
  xmlChar *name_local;
  xmlChar **prefix_local;
  xmlXPathTypeVal *type_local;
  xmlXPathTestVal *test_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (((test == (xmlXPathTestVal *)0x0) || (type == (xmlXPathTypeVal *)0x0)) ||
     (prefix == (xmlChar **)0x0)) {
    pp_Var3 = __xmlGenericError();
    p_Var1 = *pp_Var3;
    ppvVar4 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar4,"Internal error at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpath.c",
              0x2b40);
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else {
    *type = NODE_TYPE_NODE;
    *test = NODE_TEST_NONE;
    *prefix = (xmlChar *)0x0;
    while( true ) {
      bVar5 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar5 = true, 10 < *ctxt->cur)))) {
        bVar5 = *ctxt->cur == '\r';
      }
      if (!bVar5) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    if ((name == (xmlChar *)0x0) && (*ctxt->cur == '*')) {
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
      *test = NODE_TEST_ALL;
      ctxt_local = (xmlXPathParserContextPtr)0x0;
    }
    else {
      pxStack_38 = (xmlXPathParserContextPtr)name;
      if (name == (xmlChar *)0x0) {
        pxStack_38 = (xmlXPathParserContextPtr)xmlXPathParseNCName(ctxt);
      }
      if (pxStack_38 == (xmlXPathParserContextPtr)0x0) {
        xmlXPathErr(ctxt,7);
        ctxt_local = (xmlXPathParserContextPtr)0x0;
      }
      else {
        bVar5 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar5 = true, 10 < *ctxt->cur)))) {
          bVar5 = *ctxt->cur == '\r';
        }
        while( true ) {
          bVar6 = true;
          if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar6 = true, 10 < *ctxt->cur)))) {
            bVar6 = *ctxt->cur == '\r';
          }
          if (!bVar6) break;
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
        }
        if (*ctxt->cur == '(') {
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
          iVar2 = xmlStrEqual((xmlChar *)pxStack_38,"comment");
          if (iVar2 == 0) {
            iVar2 = xmlStrEqual((xmlChar *)pxStack_38,"node");
            if (iVar2 == 0) {
              iVar2 = xmlStrEqual((xmlChar *)pxStack_38,(xmlChar *)"processing-instruction");
              if (iVar2 == 0) {
                iVar2 = xmlStrEqual((xmlChar *)pxStack_38,"text");
                if (iVar2 == 0) {
                  if (pxStack_38 != (xmlXPathParserContextPtr)0x0) {
                    (*xmlFree)(pxStack_38);
                  }
                  xmlXPathErr(ctxt,7);
                  return (xmlChar *)0x0;
                }
                *type = NODE_TYPE_TEXT;
              }
              else {
                *type = NODE_TYPE_PI;
              }
            }
            else {
              *type = NODE_TYPE_NODE;
            }
          }
          else {
            *type = NODE_TYPE_COMMENT;
          }
          *test = NODE_TEST_TYPE;
          while( true ) {
            bVar5 = true;
            if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar5 = true, 10 < *ctxt->cur)))) {
              bVar5 = *ctxt->cur == '\r';
            }
            if (!bVar5) break;
            if (*ctxt->cur != '\0') {
              ctxt->cur = ctxt->cur + 1;
            }
          }
          if (*type == NODE_TYPE_PI) {
            if (pxStack_38 != (xmlXPathParserContextPtr)0x0) {
              (*xmlFree)(pxStack_38);
            }
            pxStack_38 = (xmlXPathParserContextPtr)0x0;
            if (*ctxt->cur != ')') {
              pxStack_38 = (xmlXPathParserContextPtr)xmlXPathParseLiteral(ctxt);
              if (ctxt->error != 0) {
                return (xmlChar *)0x0;
              }
              *test = NODE_TEST_PI;
              while( true ) {
                bVar5 = true;
                if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar5 = true, 10 < *ctxt->cur)))) {
                  bVar5 = *ctxt->cur == '\r';
                }
                if (!bVar5) break;
                if (*ctxt->cur != '\0') {
                  ctxt->cur = ctxt->cur + 1;
                }
              }
            }
          }
          if (*ctxt->cur == ')') {
            if (*ctxt->cur != '\0') {
              ctxt->cur = ctxt->cur + 1;
            }
            ctxt_local = pxStack_38;
          }
          else {
            if (pxStack_38 != (xmlXPathParserContextPtr)0x0) {
              (*xmlFree)(pxStack_38);
            }
            xmlXPathErr(ctxt,8);
            ctxt_local = (xmlXPathParserContextPtr)0x0;
          }
        }
        else {
          *test = NODE_TEST_NAME;
          if ((!bVar5) && (*ctxt->cur == ':')) {
            if (*ctxt->cur != '\0') {
              ctxt->cur = ctxt->cur + 1;
            }
            *prefix = (xmlChar *)pxStack_38;
            if (*ctxt->cur == '*') {
              if (*ctxt->cur != '\0') {
                ctxt->cur = ctxt->cur + 1;
              }
              *test = NODE_TEST_ALL;
              return (xmlChar *)0x0;
            }
            pxStack_38 = (xmlXPathParserContextPtr)xmlXPathParseNCName(ctxt);
            if (pxStack_38 == (xmlXPathParserContextPtr)0x0) {
              xmlXPathErr(ctxt,7);
              return (xmlChar *)0x0;
            }
          }
          ctxt_local = pxStack_38;
        }
      }
    }
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

static xmlChar *
xmlXPathCompNodeTest(xmlXPathParserContextPtr ctxt, xmlXPathTestVal *test,
	             xmlXPathTypeVal *type, xmlChar **prefix,
		     xmlChar *name) {
    int blanks;

    if ((test == NULL) || (type == NULL) || (prefix == NULL)) {
	STRANGE;
	return(NULL);
    }
    *type = (xmlXPathTypeVal) 0;
    *test = (xmlXPathTestVal) 0;
    *prefix = NULL;
    SKIP_BLANKS;

    if ((name == NULL) && (CUR == '*')) {
	/*
	 * All elements
	 */
	NEXT;
	*test = NODE_TEST_ALL;
	return(NULL);
    }

    if (name == NULL)
	name = xmlXPathParseNCName(ctxt);
    if (name == NULL) {
	XP_ERRORNULL(XPATH_EXPR_ERROR);
    }

    blanks = IS_BLANK_CH(CUR);
    SKIP_BLANKS;
    if (CUR == '(') {
	NEXT;
	/*
	 * NodeType or PI search
	 */
	if (xmlStrEqual(name, BAD_CAST "comment"))
	    *type = NODE_TYPE_COMMENT;
	else if (xmlStrEqual(name, BAD_CAST "node"))
	    *type = NODE_TYPE_NODE;
	else if (xmlStrEqual(name, BAD_CAST "processing-instruction"))
	    *type = NODE_TYPE_PI;
	else if (xmlStrEqual(name, BAD_CAST "text"))
	    *type = NODE_TYPE_TEXT;
	else {
	    if (name != NULL)
		xmlFree(name);
	    XP_ERRORNULL(XPATH_EXPR_ERROR);
	}

	*test = NODE_TEST_TYPE;

	SKIP_BLANKS;
	if (*type == NODE_TYPE_PI) {
	    /*
	     * Specific case: search a PI by name.
	     */
	    if (name != NULL)
		xmlFree(name);
	    name = NULL;
	    if (CUR != ')') {
		name = xmlXPathParseLiteral(ctxt);
		CHECK_ERROR NULL;
		*test = NODE_TEST_PI;
		SKIP_BLANKS;
	    }
	}
	if (CUR != ')') {
	    if (name != NULL)
		xmlFree(name);
	    XP_ERRORNULL(XPATH_UNCLOSED_ERROR);
	}
	NEXT;
	return(name);
    }
    *test = NODE_TEST_NAME;
    if ((!blanks) && (CUR == ':')) {
	NEXT;

	/*
	 * Since currently the parser context don't have a
	 * namespace list associated:
	 * The namespace name for this prefix can be computed
	 * only at evaluation time. The compilation is done
	 * outside of any context.
	 */
#if 0
	*prefix = xmlXPathNsLookup(ctxt->context, name);
	if (name != NULL)
	    xmlFree(name);
	if (*prefix == NULL) {
	    XP_ERROR0(XPATH_UNDEF_PREFIX_ERROR);
	}
#else
	*prefix = name;
#endif

	if (CUR == '*') {
	    /*
	     * All elements
	     */
	    NEXT;
	    *test = NODE_TEST_ALL;
	    return(NULL);
	}

	name = xmlXPathParseNCName(ctxt);
	if (name == NULL) {
	    XP_ERRORNULL(XPATH_EXPR_ERROR);
	}
    }
    return(name);
}